

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::CannotAllocateArgumentsObjectOnStack(GlobOpt *this,Func *curFunc)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITOutput *pJVar3;
  JITOutputIDL *pJVar4;
  undefined4 *puVar5;
  RejitException *this_00;
  JITTimeFunctionBody *this_01;
  char16 *pcVar6;
  char16 *pcVar7;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  Func *curFunc_local;
  GlobOpt *this_local;
  
  if ((curFunc != (Func *)0x0) && ((*(uint *)&curFunc->field_0x240 >> 7 & 1) != 0)) {
    pJVar3 = Func::GetJITOutput(curFunc);
    pJVar4 = JITOutput::GetOutputData(pJVar3);
    if (pJVar4->disableStackArgOpt != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3f02,"(!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt)",
                         "!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pJVar3 = Func::GetJITOutput(curFunc);
    pJVar4 = JITOutput::GetOutputData(pJVar3);
    pJVar4->disableStackArgOpt = '\x01';
    this_00 = (RejitException *)__cxa_allocate_exception(1);
    Js::RejitException::RejitException(this_00,DisableStackArgLenAndConstOpt);
    __cxa_throw(this_00,&Js::RejitException::typeinfo,0);
  }
  Func::SetHasStackArgs(this->func,false);
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackArgOptPhase,sourceContextId,functionId)
  ;
  if (bVar2) {
    this_01 = Func::GetJITFunctionBody(this->func);
    pcVar6 = JITTimeFunctionBody::GetDisplayName(this_01);
    pcVar7 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_78);
    Output::Print(L"Stack args disabled for function %s(%s)\n",pcVar6,pcVar7);
    Output::Flush();
  }
  return;
}

Assistant:

void
GlobOpt::CannotAllocateArgumentsObjectOnStack(Func * curFunc)
{
    if (curFunc != nullptr && curFunc->hasArgLenAndConstOpt)
    {
        Assert(!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt);
        curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt = true;
        throw Js::RejitException(RejitReason::DisableStackArgLenAndConstOpt);
    }

    func->SetHasStackArgs(false);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TESTTRACE(Js::StackArgOptPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Stack args disabled for function %s(%s)\n"), func->GetJITFunctionBody()->GetDisplayName(), func->GetDebugNumberSet(debugStringBuffer));
        Output::Flush();
    }
#endif
}